

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,TypeBase *type,
          ArrayView<ArgumentData> currArguments,IntrusiveList<MatchData> aliases)

{
  uint *this;
  uint uVar1;
  TypeHandle *pTVar2;
  ArgumentData *pAVar3;
  TypeBase *pTVar4;
  TypeFunction *argumentType;
  ExprBase *pEVar5;
  uint i;
  uint uVar6;
  ArrayView<ArgumentData> local_40;
  
  local_40.data = currArguments.data;
  uVar6 = currArguments.count;
  if ((type != (TypeBase *)0x0) && (type->typeID == 0x15)) {
    this = &type[1].typeID;
    local_40.count = uVar6;
    uVar1 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)this);
    if (uVar6 + 1 <= uVar1) {
      if (type->isGeneric == true) {
        uVar6 = 0;
        while (uVar6 < local_40.count) {
          pTVar2 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,uVar6);
          pTVar4 = pTVar2->type;
          pAVar3 = ArrayView<ArgumentData>::operator[](&local_40,uVar6);
          pTVar4 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar4,pAVar3->type,&aliases,false);
          uVar6 = uVar6 + 1;
          if (pTVar4 == (TypeBase *)0x0) {
            return (ExprBase *)0x0;
          }
        }
        pTVar2 = IntrusiveList<TypeHandle>::operator[]
                           ((IntrusiveList<TypeHandle> *)this,local_40.count);
        argumentType = (TypeFunction *)
                       ResolveGenericTypeAliases(ctx,&syntax->super_SynBase,pTVar2->type,aliases);
      }
      else {
        pTVar2 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,uVar6);
        argumentType = (TypeFunction *)pTVar2->type;
      }
      if ((argumentType != (TypeFunction *)0x0) && ((argumentType->super_TypeBase).typeID == 0x15))
      {
        pEVar5 = AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,argumentType);
        return pEVar5;
      }
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, TypeBase *type, ArrayView<ArgumentData> currArguments, IntrusiveList<MatchData> aliases)
{
	TypeFunction *functionType = getType<TypeFunction>(type);

	// Only applies to function calls
	if(!functionType)
		return NULL;

	IntrusiveList<TypeHandle> &fuctionArgs = functionType->arguments;

	// Function doesn't accept any more arguments
	if(currArguments.size() + 1 > fuctionArgs.size())
		return NULL;

	// Get current argument type
	TypeBase *target = NULL;

	if(functionType->isGeneric)
	{
		// Collect aliases up to the current argument
		for(unsigned i = 0; i < currArguments.size(); i++)
		{
			// Exit if the arguments before the short inline function fail to match
			if(!MatchGenericType(ctx, syntax, fuctionArgs[i]->type, currArguments[i].type, aliases, false))
				return NULL;
		}

		target = ResolveGenericTypeAliases(ctx, syntax, fuctionArgs[currArguments.size()]->type, aliases);
	}
	else
	{
		target = fuctionArgs[currArguments.size()]->type;
	}

	TypeFunction *argumentType = getType<TypeFunction>(target);

	if(!argumentType)
		return NULL;

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, argumentType);
}